

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitTableCopy(PrintExpressionContents *this,TableCopy *curr)

{
  ostream *stream;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  stream = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"table.copy ",0xb);
  Colors::outputColorCode(stream,"\x1b[0m");
  Name::print(&curr->destTable,this->o);
  uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
  Name::print(&curr->sourceTable,this->o);
  return;
}

Assistant:

void visitTableCopy(TableCopy* curr) {
    printMedium(o, "table.copy ");
    curr->destTable.print(o);
    o << ' ';
    curr->sourceTable.print(o);
  }